

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# analyser.cpp
# Opt level: O2

void __thiscall Analyser::modifyInstruction(Analyser *this,int32_t index,Instruction *ins)

{
  int32_t iVar1;
  int iVar2;
  undefined4 uVar3;
  undefined4 uVar5;
  long lVar4;
  string *this_00;
  long lVar6;
  allocator<char> local_39;
  string local_38 [32];
  
  if ((long)this->_currentFunction != -1) {
    uVar3 = ins->_opr;
    uVar5 = ins->_x;
    iVar1 = ins->_y;
    lVar4 = *(long *)&(this->_instructions).
                      super__Vector_base<std::vector<Instruction,_std::allocator<Instruction>_>,_std::allocator<std::vector<Instruction,_std::allocator<Instruction>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_start[this->_currentFunction].
                      super__Vector_base<Instruction,_std::allocator<Instruction>_>._M_impl.
                      super__Vector_impl_data;
    lVar6 = (long)index * 0x10;
    *(undefined4 *)(lVar4 + lVar6) = uVar3;
    *(undefined4 *)(lVar4 + 4 + lVar6) = uVar5;
    *(int32_t *)(lVar4 + 8 + lVar6) = iVar1;
    return;
  }
  this_00 = (string *)__cxa_allocate_exception(0x28);
  std::__cxx11::string::string<std::allocator<char>>
            (local_38,"can not call MI in start code",&local_39);
  iVar2 = this->_currentLine;
  std::__cxx11::string::string(this_00,local_38);
  *(long *)(this_00 + 0x20) = (long)iVar2;
  __cxa_throw(this_00,&Error::typeinfo,Error::~Error);
}

Assistant:

void Analyser::modifyInstruction(const std::int32_t index, const Instruction& ins)
{
	if (_currentFunction == -1) {
		throw Error("can not call MI in start code", _currentLine);
	}
	_instructions[_currentFunction][index] = ins;
}